

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsTextItemPrivate::_q_update(QGraphicsTextItemPrivate *this,QRectF rect)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QGraphicsTextItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF *in_stack_ffffffffffffffb8;
  QRectF *this_00;
  QRectF *pQVar4;
  QPointF in_stack_ffffffffffffffd8;
  
  this_00 = (QRectF *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRectF::isValid(this_00);
  if (bVar2) {
    in_stack_ffffffffffffffd8 = controlOffset(in_RDI);
    ::operator-((QPointF *)in_RDI);
    QRectF::translate(this_00,in_stack_ffffffffffffffb8);
  }
  else {
    pQVar4 = this_00;
    this_00->xp = (in_RDI->boundingRect).xp;
    this_00->yp = (in_RDI->boundingRect).yp;
    this_00->w = (in_RDI->boundingRect).w;
    this_00->h = (in_RDI->boundingRect).h;
    this_00 = pQVar4;
  }
  uVar3 = QRectF::intersects((QRectF *)this_00);
  if ((uVar3 & 1) != 0) {
    QGraphicsItem::update
              ((QGraphicsItem *)in_stack_ffffffffffffffd8.yp,(QRectF *)in_stack_ffffffffffffffd8.xp)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsTextItemPrivate::_q_update(QRectF rect)
{
    if (rect.isValid()) {
        rect.translate(-controlOffset());
    } else {
        rect = boundingRect;
    }
    if (rect.intersects(boundingRect))
        qq->update(rect);
}